

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void rgba16ToPixel(uchar *out,size_t i,LodePNGColorMode *mode,unsigned_short r,unsigned_short g,
                  unsigned_short b,unsigned_short a)

{
  uchar uVar1;
  uchar uVar3;
  uchar uVar5;
  unsigned_short gray_1;
  unsigned_short gray;
  unsigned_short b_local;
  unsigned_short g_local;
  unsigned_short r_local;
  LodePNGColorMode *mode_local;
  size_t i_local;
  uchar *out_local;
  uchar uVar2;
  uchar uVar4;
  
  uVar1 = (uchar)r;
  uVar2 = (uchar)(r >> 8);
  if (mode->colortype == LCT_GREY) {
    out[i * 2] = uVar2;
    out[i * 2 + 1] = uVar1;
  }
  else {
    uVar3 = (uchar)(g >> 8);
    uVar4 = (uchar)(b >> 8);
    if (mode->colortype == LCT_RGB) {
      out[i * 6] = uVar2;
      out[i * 6 + 1] = uVar1;
      out[i * 6 + 2] = uVar3;
      out[i * 6 + 3] = (uchar)g;
      out[i * 6 + 4] = uVar4;
      out[i * 6 + 5] = (uchar)b;
    }
    else {
      uVar5 = (uchar)(a >> 8);
      if (mode->colortype == LCT_GREY_ALPHA) {
        out[i * 4] = uVar2;
        out[i * 4 + 1] = uVar1;
        out[i * 4 + 2] = uVar5;
        out[i * 4 + 3] = (uchar)a;
      }
      else if (mode->colortype == LCT_RGBA) {
        out[i * 8] = uVar2;
        out[i * 8 + 1] = uVar1;
        out[i * 8 + 2] = uVar3;
        out[i * 8 + 3] = (uchar)g;
        out[i * 8 + 4] = uVar4;
        out[i * 8 + 5] = (uchar)b;
        out[i * 8 + 6] = uVar5;
        out[i * 8 + 7] = (uchar)a;
      }
    }
  }
  return;
}

Assistant:

static void rgba16ToPixel(unsigned char* out, size_t i,
                         const LodePNGColorMode* mode,
                         unsigned short r, unsigned short g, unsigned short b, unsigned short a) {
  if(mode->colortype == LCT_GREY) {
    unsigned short gray = r; /*((unsigned)r + g + b) / 3u;*/
    out[i * 2 + 0] = (gray >> 8) & 255;
    out[i * 2 + 1] = gray & 255;
  } else if(mode->colortype == LCT_RGB) {
    out[i * 6 + 0] = (r >> 8) & 255;
    out[i * 6 + 1] = r & 255;
    out[i * 6 + 2] = (g >> 8) & 255;
    out[i * 6 + 3] = g & 255;
    out[i * 6 + 4] = (b >> 8) & 255;
    out[i * 6 + 5] = b & 255;
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    unsigned short gray = r; /*((unsigned)r + g + b) / 3u;*/
    out[i * 4 + 0] = (gray >> 8) & 255;
    out[i * 4 + 1] = gray & 255;
    out[i * 4 + 2] = (a >> 8) & 255;
    out[i * 4 + 3] = a & 255;
  } else if(mode->colortype == LCT_RGBA) {
    out[i * 8 + 0] = (r >> 8) & 255;
    out[i * 8 + 1] = r & 255;
    out[i * 8 + 2] = (g >> 8) & 255;
    out[i * 8 + 3] = g & 255;
    out[i * 8 + 4] = (b >> 8) & 255;
    out[i * 8 + 5] = b & 255;
    out[i * 8 + 6] = (a >> 8) & 255;
    out[i * 8 + 7] = a & 255;
  }
}